

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O0

istream * Gudhi::operator>>(istream *is,Simplex_tree<Gudhi::Simplex_tree_options_full_featured> *st)

{
  bool bVar1;
  size_type sVar2;
  undefined1 local_60 [24];
  int dim;
  int local_3c;
  int max_dim;
  Filtration_value fil;
  vector<int,_std::allocator<int>_> simplex;
  Simplex_tree<Gudhi::Simplex_tree_options_full_featured> *st_local;
  istream *is_local;
  
  simplex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)st;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)&fil);
  local_3c = -1;
  while( true ) {
    bVar1 = read_simplex<int,double>
                      (is,(vector<int,_std::allocator<int>_> *)&fil,
                       (double *)&stack0xffffffffffffffc8);
    if (!bVar1) break;
    sVar2 = std::vector<int,_std::allocator<int>_>::size((vector<int,_std::allocator<int>_> *)&fil);
    local_60._16_4_ = (int)sVar2 + -1;
    if (local_3c < (int)local_60._16_4_) {
      local_3c = local_60._16_4_;
    }
    Simplex_tree<Gudhi::Simplex_tree_options_full_featured>::
    insert_simplex<std::vector<int,std::allocator<int>>>
              ((Simplex_tree<Gudhi::Simplex_tree_options_full_featured> *)local_60,
               (vector<int,_std::allocator<int>_> *)
               simplex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
               ._M_end_of_storage,&fil);
    std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)&fil);
  }
  Simplex_tree<Gudhi::Simplex_tree_options_full_featured>::set_dimension
            ((Simplex_tree<Gudhi::Simplex_tree_options_full_featured> *)
             simplex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage,local_3c,true);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&fil);
  return is;
}

Assistant:

std::istream& operator>>(std::istream & is, Simplex_tree<T...> & st) {
  typedef Simplex_tree<T...> ST;
  std::vector<typename ST::Vertex_handle> simplex;
  typename ST::Filtration_value fil;
  int max_dim = -1;
  while (read_simplex(is, simplex, fil)) {
    // read all simplices in the file as a list of vertices
    // Warning : simplex_size needs to be casted in int - Can be 0
    int dim = static_cast<int> (simplex.size() - 1);
    if (max_dim < dim) {
      max_dim = dim;
    }
    // insert every simplex in the simplex tree
    st.insert_simplex(simplex, fil);
    simplex.clear();
  }
  st.set_dimension(max_dim);

  return is;
}